

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_IXOR_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  bVar2 = instr->src;
  poVar3 = std::operator<<((ostream *)&this->field_0x10,"\txor ");
  poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)instr->dst * 8));
  poVar3 = std::operator<<(poVar3,", ");
  if (bVar2 == bVar1) {
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,instr->imm32);
  }
  else {
    poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)instr->src * 8));
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IXOR_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			asmCode << "\txor " << regR[instr.dst] << ", " << regR[instr.src] << std::endl;
		}
		else {
			asmCode << "\txor " << regR[instr.dst] << ", " << (int32_t)instr.getImm32() << std::endl;
		}
		traceint(instr);
	}